

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

Type flexbuffers::ToTypedVector(Type t,size_t fixed_len)

{
  bool bVar1;
  size_t fixed_len_local;
  Type t_local;
  
  bVar1 = IsTypedVectorElementType(t);
  if (bVar1) {
    switch(fixed_len) {
    case 0:
      fixed_len_local._4_4_ = t + FBT_VECTOR;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                    ,0x6f,"Type flexbuffers::ToTypedVector(Type, size_t)");
    case 2:
      fixed_len_local._4_4_ = t + FBT_VECTOR_STRING_DEPRECATED;
      break;
    case 3:
      fixed_len_local._4_4_ = t + FBT_VECTOR_FLOAT2;
      break;
    case 4:
      fixed_len_local._4_4_ = t + FBT_VECTOR_FLOAT3;
    }
    return fixed_len_local._4_4_;
  }
  __assert_fail("IsTypedVectorElementType(t)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x69,"Type flexbuffers::ToTypedVector(Type, size_t)");
}

Assistant:

inline Type ToTypedVector(Type t, size_t fixed_len = 0) {
  FLATBUFFERS_ASSERT(IsTypedVectorElementType(t));
  switch (fixed_len) {
    case 0: return static_cast<Type>(t - FBT_INT + FBT_VECTOR_INT);
    case 2: return static_cast<Type>(t - FBT_INT + FBT_VECTOR_INT2);
    case 3: return static_cast<Type>(t - FBT_INT + FBT_VECTOR_INT3);
    case 4: return static_cast<Type>(t - FBT_INT + FBT_VECTOR_INT4);
    default: FLATBUFFERS_ASSERT(0); return FBT_NULL;
  }
}